

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_fxrstor_x86_64(CPUX86State *env,target_ulong ptr)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  if ((ptr & 0xf) != 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  do_xrstor_fpu(env,ptr,unaff_retaddr);
  if ((*(byte *)((long)env->cr + 0x21) & 2) != 0) {
    uVar1 = cpu_ldl_data_ra_x86_64(env,ptr + 0x18,unaff_retaddr);
    env->mxcsr = uVar1;
    (env->sse_status).float_rounding_mode = (byte)(uVar1 >> 0xd) & 3;
    (env->sse_status).flush_inputs_to_zero = (byte)uVar1 >> 6 & 1;
    (env->fp_status).flush_to_zero = (byte)(uVar1 >> 0xf) & 1;
    if (((env->efer & 0x4000) == 0) || ((env->hflags & 0x4003) != 0x4000)) {
      do_xrstor_sse(env,ptr,unaff_retaddr);
      return;
    }
  }
  return;
}

Assistant:

void helper_fxrstor(CPUX86State *env, target_ulong ptr)
{
    uintptr_t ra = GETPC();

    /* The operand must be 16 byte aligned */
    if (ptr & 0xf) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    do_xrstor_fpu(env, ptr, ra);

    if (env->cr[4] & CR4_OSFXSR_MASK) {
        do_xrstor_mxcsr(env, ptr, ra);
        /* Fast FXRSTOR leaves out the XMM registers */
        if (!(env->efer & MSR_EFER_FFXSR)
            || (env->hflags & HF_CPL_MASK)
            || !(env->hflags & HF_LMA_MASK)) {
            do_xrstor_sse(env, ptr, ra);
        }
    }
}